

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void am_generalize_match_double_click_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *list_value;
  Am_Object scroll_menu;
  Am_Value_List sel_list;
  Am_Object invoke_window;
  
  Am_Object::Get_Object((Am_Object *)&sel_list,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&scroll_menu,(Am_Slot_Flags)&sel_list);
  Am_Object::~Am_Object((Am_Object *)&sel_list);
  Am_Object::Get_Owner(&invoke_window,(Am_Slot_Flags)&scroll_menu);
  list_value = Am_Object::Get(&scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List(&sel_list,list_value);
  bVar1 = Am_Value_List::Valid(&sel_list);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout," POP UP GENERALIZE MATCH DB\n");
    std::ostream::flush();
    Am_Pop_Up_Generalize_Match_DB(&invoke_window,&sel_list);
  }
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&invoke_window);
  Am_Object::~Am_Object(&scroll_menu);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_generalize_match_double_click,
                 (Am_Object cmd))
{
  //cmd in inter on scroll_menu on invoke_window
  Am_Object scroll_menu = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object invoke_window = scroll_menu.Get_Owner();
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid()) {
    std::cout << " POP UP GENERALIZE MATCH DB\n" << std::flush;
    Am_Pop_Up_Generalize_Match_DB(invoke_window, sel_list);
  }
}